

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token.cc
# Opt level: O0

void __thiscall wabt::Token::Destroy(Token *this)

{
  bool bVar1;
  Token *this_local;
  
  bVar1 = HasLiteral(this);
  if (bVar1) {
    Destruct<wabt::Literal>(&(this->field_2).literal_);
  }
  else {
    bVar1 = HasOpcode(this);
    if (bVar1) {
      Destruct<wabt::Opcode>(&(this->field_2).opcode_);
    }
    else {
      bVar1 = HasText(this);
      if (bVar1) {
        Destruct<std::__cxx11::string>(&(this->field_2).text_);
      }
      else {
        bVar1 = HasType(this);
        if (bVar1) {
          Destruct<wabt::Type>(&(this->field_2).type_);
        }
      }
    }
  }
  this->token_type_ = First;
  return;
}

Assistant:

void Token::Destroy() {
  if (HasLiteral()) {
    Destruct(literal_);
  } else if (HasOpcode()) {
    Destruct(opcode_);
  } else if (HasText()) {
    Destruct(text_);
  } else if (HasType()) {
    Destruct(type_);
  }
  token_type_ = TokenType::Invalid;
}